

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_buffer.hpp
# Opt level: O3

BooleanArray2D * __thiscall
CircularBuffer<BooleanArray2D_*>::push
          (CircularBuffer<BooleanArray2D_*> *this,BooleanArray2D *element)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  BooleanArray2D *pBVar2;
  
  uVar3 = this->count_of_elements;
  if (this->count_of_slots == uVar3) {
    iVar1 = (*this->_vptr_CircularBuffer[3])(this);
    pBVar2 = (BooleanArray2D *)CONCAT44(extraout_var,iVar1);
    uVar3 = this->count_of_elements;
  }
  else {
    pBVar2 = (BooleanArray2D *)0x0;
  }
  if (uVar3 == 0) {
    this->first_element_index = 0;
    this->last_element_index = 0;
  }
  else {
    if (this->last_element_index != this->count_of_slots - 1) {
      uVar4 = this->last_element_index + 1;
      uVar5 = (ulong)uVar4;
      this->last_element_index = uVar4;
      goto LAB_001147ce;
    }
    this->last_element_index = 0;
  }
  uVar5 = 0;
LAB_001147ce:
  this->data[uVar5] = element;
  this->count_of_elements = uVar3 + 1;
  return pBVar2;
}

Assistant:

T *CircularBuffer<T *>::push(T *element)
{
    T *ret;
    if(count_of_slots == count_of_elements) {
        //remove first element to make room for the new one, return it so the caller can deal with removed element
        ret = pop();
    } else {
        ret = nullptr;
    }
    if(count_of_elements == 0) {
        first_element_index = 0;
        last_element_index = 0;
    } else {
        if(last_element_index == count_of_slots - 1) {
            last_element_index = 0;
        } else {
            last_element_index++;
        }
    }
    data[last_element_index] = element;
    count_of_elements++;
    return ret;
}